

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
resizeLike<Eigen::GeneralProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::GeneralProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>
          *_other)

{
  ulong nbRows;
  ulong nbCols;
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  
  nbRows = *(ulong *)(*(long *)(_other + 8) + 8);
  nbCols = *(ulong *)(*(long *)(_other + 0x18) + 0x10);
  bVar4 = nbCols == 0 || nbRows == 0;
  if ((bVar4) ||
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar3 = SUB168(auVar1 % SEXT816((long)nbCols),0),
     (long)nbRows <= SUB168(auVar1 / SEXT816((long)nbCols),0))) {
    if ((long)(nbCols | nbRows) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ctsuu[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar4) ||
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar3 = SUB168(auVar1 % SEXT816((long)nbCols),0),
       (long)nbRows <= SUB168(auVar1 / SEXT816((long)nbCols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * nbRows,nbRows,nbCols);
      return;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8,bVar4,uVar3);
  *puVar2 = operator_delete;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(Index(other.rows()), Index(other.cols()));
      const Index othersize = Index(other.rows())*Index(other.cols());
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }